

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O0

void verify_sparse_file2(archive *a,char *path,sparse *sparse,int blocks,int preopen)

{
  wchar_t line;
  archive_entry *file;
  long v1;
  int in_ECX;
  char *in_RSI;
  longlong in_RDI;
  int in_R8D;
  int fd;
  archive_entry *ae;
  stat_conflict *in_stack_000000b0;
  int in_stack_000000bc;
  archive_entry *in_stack_000000c0;
  archive *in_stack_000000c8;
  char *in_stack_ffffffffffffffb8;
  archive_entry *in_stack_ffffffffffffffc0;
  longlong in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  file = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffb8);
  archive_entry_set_pathname(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (in_R8D == 0) {
    line = L'\xffffffff';
  }
  else {
    line = open(in_RSI,0);
  }
  archive_read_disk_entry_from_file
            (in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,in_stack_000000b0);
  assertion_equal_int((char *)file,line,in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                      in_RDI,(char *)0x1c9a97,in_RSI);
  if (L'\xffffffff' < line) {
    close(line);
  }
  v1 = (long)in_ECX;
  archive_entry_sparse_count((archive_entry *)CONCAT44(line,in_stack_ffffffffffffffd0));
  assertion_equal_int((char *)file,line,v1,(char *)in_stack_ffffffffffffffc0,0,(char *)0x1c9aec,
                      in_RSI);
  archive_entry_free((archive_entry *)0x1c9af6);
  return;
}

Assistant:

static void
verify_sparse_file2(struct archive *a, const char *path,
    const struct sparse *sparse, int blocks, int preopen)
{
	struct archive_entry *ae;
	int fd;

	(void)sparse; /* UNUSED */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, path);
	if (preopen)
		fd = open(path, O_RDONLY | O_BINARY);
	else
		fd = -1;
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_disk_entry_from_file(a, ae, fd, NULL));
	if (fd >= 0)
		close(fd);
	/* Verify the number of holes only, not its offset nor its
	 * length because those alignments are deeply dependence on
	 * its filesystem. */ 
	assertEqualInt(blocks, archive_entry_sparse_count(ae));
	archive_entry_free(ae);
}